

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrApplyHapticFeedback
                   (XrSession session,XrHapticActionInfo *hapticActionInfo,
                   XrHapticBaseHeader *hapticFeedback)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  XrStructureType XVar3;
  XrResult XVar4;
  GenValidUsageXrInstanceInfo *instance_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *p_Var5;
  XrHapticVibration *new_hapticvibration_value;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar6;
  XrSession_T *in_stack_fffffffffffffd18;
  allocator local_2da;
  allocator local_2d9;
  string local_2d8;
  string local_2b8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrSession session_local;
  string local_278;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 2;
  session_local = session;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&session_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrSessionHandle(&session_local);
  if (VVar1 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(in_stack_fffffffffffffd18);
    std::operator<<((ostream *)&oss,(string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::string
              ((string *)&local_2d8,"VUID-xrApplyHapticFeedback-session-parameter",&local_2da);
    std::__cxx11::string::string((string *)&local_2b8,"xrApplyHapticFeedback",&local_2d9);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_2d8,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b0,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b0);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
    goto LAB_001ccb0e;
  }
  pVar6 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,session_local);
  instance_info = pVar6.second;
  if (hapticActionInfo == (XrHapticActionInfo *)0x0) {
    std::__cxx11::string::string
              ((string *)&oss,"VUID-xrApplyHapticFeedback-hapticActionInfo-parameter",
               (allocator *)&local_278);
    std::__cxx11::string::string((string *)&local_2d8,"xrApplyHapticFeedback",&local_2da);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c8,&objects_info);
    std::__cxx11::string::string
              ((string *)&local_2b8,
               "Invalid NULL for XrHapticActionInfo \"hapticActionInfo\" which is not optional and must be non-NULL"
               ,&local_2d9);
    CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2d8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c8,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    p_Var5 = &local_1c8;
LAB_001ccaef:
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(p_Var5);
  }
  else {
    std::__cxx11::string::string((string *)&oss,"xrApplyHapticFeedback",(allocator *)&local_2d8);
    XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,true,true,hapticActionInfo);
    std::__cxx11::string::~string((string *)&oss);
    if (XVar2 != XR_SUCCESS) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrApplyHapticFeedback-hapticActionInfo-parameter",
                 (allocator *)&local_278);
      std::__cxx11::string::string((string *)&local_2d8,"xrApplyHapticFeedback",&local_2da);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1e0,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_2b8,
                 "Command xrApplyHapticFeedback param hapticActionInfo is invalid",&local_2d9);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2d8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1e0,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1e0);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&oss);
      goto LAB_001ccb0e;
    }
    if (hapticFeedback == (XrHapticBaseHeader *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                 (allocator *)&local_278);
      std::__cxx11::string::string((string *)&local_2d8,"xrApplyHapticFeedback",&local_2da);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1f8,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_2b8,
                 "Invalid NULL for XrHapticBaseHeader \"hapticFeedback\" which is not optional and must be non-NULL"
                 ,&local_2d9);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2d8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1f8,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      p_Var5 = &local_1f8;
      goto LAB_001ccaef;
    }
    XVar3 = hapticFeedback->type;
    if (XVar3 != XR_TYPE_HAPTIC_VIBRATION) {
LAB_001cccbe:
      if (XVar3 == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB) {
        std::__cxx11::string::string((string *)&oss,"xrApplyHapticFeedback",(allocator *)&local_2d8)
        ;
        XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,
                                 (XrHapticAmplitudeEnvelopeVibrationFB *)hapticFeedback);
        std::__cxx11::string::~string((string *)&oss);
        if (XVar2 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&oss,"Command xrApplyHapticFeedback param hapticFeedback",
                     (allocator *)&local_2d8);
          std::__cxx11::string::append((char *)&oss);
          std::__cxx11::string::string
                    ((string *)&local_2d8,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                     (allocator *)&local_278);
          std::__cxx11::string::string((string *)&local_2b8,"xrApplyHapticFeedback",&local_2da);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_228,&objects_info);
          CoreValidLogMessage(instance_info,&local_2d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b8,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_228,(string *)&oss);
          p_Var5 = &local_228;
          goto LAB_001ccea8;
        }
        XVar3 = hapticFeedback->type;
      }
      if (XVar3 == XR_TYPE_HAPTIC_PCM_VIBRATION_FB) {
        std::__cxx11::string::string((string *)&oss,"xrApplyHapticFeedback",(allocator *)&local_2d8)
        ;
        XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,
                                 (XrHapticPcmVibrationFB *)hapticFeedback);
        std::__cxx11::string::~string((string *)&oss);
        if (XVar2 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&oss,"Command xrApplyHapticFeedback param hapticFeedback",
                     (allocator *)&local_2d8);
          std::__cxx11::string::append((char *)&oss);
          std::__cxx11::string::string
                    ((string *)&local_2d8,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                     (allocator *)&local_278);
          std::__cxx11::string::string((string *)&local_2b8,"xrApplyHapticFeedback",&local_2da);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_240,&objects_info);
          CoreValidLogMessage(instance_info,&local_2d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b8,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_240,(string *)&oss);
          p_Var5 = &local_240;
          goto LAB_001ccea8;
        }
      }
      std::__cxx11::string::string((string *)&oss,"xrApplyHapticFeedback",(allocator *)&local_2d8);
      XVar2 = XR_SUCCESS;
      XVar4 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,true,false,hapticFeedback)
      ;
      std::__cxx11::string::~string((string *)&oss);
      if (XVar4 == XR_SUCCESS) goto LAB_001ccb0e;
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                 (allocator *)&local_278);
      std::__cxx11::string::string((string *)&local_2d8,"xrApplyHapticFeedback",&local_2da);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_258,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_2b8,
                 "Command xrApplyHapticFeedback param hapticFeedback is invalid",&local_2d9);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2d8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_258,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      p_Var5 = &local_258;
      goto LAB_001ccaef;
    }
    std::__cxx11::string::string((string *)&oss,"xrApplyHapticFeedback",(allocator *)&local_2d8);
    XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,
                             (XrHapticVibration *)hapticFeedback);
    std::__cxx11::string::~string((string *)&oss);
    if (XVar2 == XR_SUCCESS) {
      XVar3 = hapticFeedback->type;
      goto LAB_001cccbe;
    }
    std::__cxx11::string::string
              ((string *)&oss,"Command xrApplyHapticFeedback param hapticFeedback",
               (allocator *)&local_2d8);
    std::__cxx11::string::append((char *)&oss);
    std::__cxx11::string::string
              ((string *)&local_2d8,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
               (allocator *)&local_278);
    std::__cxx11::string::string((string *)&local_2b8,"xrApplyHapticFeedback",&local_2da);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_210,&objects_info);
    CoreValidLogMessage(instance_info,&local_2d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_210,(string *)&oss);
    p_Var5 = &local_210;
LAB_001ccea8:
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(p_Var5);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&oss);
  XVar2 = XR_ERROR_VALIDATION_FAILURE;
LAB_001ccb0e:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrApplyHapticFeedback(
XrSession session,
const XrHapticActionInfo* hapticActionInfo,
const XrHapticBaseHeader* hapticFeedback) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrApplyHapticFeedback-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == hapticActionInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticActionInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback", objects_info,
                                "Invalid NULL for XrHapticActionInfo \"hapticActionInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrHapticActionInfo is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback", objects_info,
                                                        true, true, hapticActionInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticActionInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                objects_info,
                                "Command xrApplyHapticFeedback param hapticActionInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == hapticFeedback) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback", objects_info,
                                "Invalid NULL for XrHapticBaseHeader \"hapticFeedback\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate if XrHapticBaseHeader is a child structure of type XrHapticVibration and it is valid
        {
            const XrHapticVibration* new_hapticvibration_value = reinterpret_cast<const XrHapticVibration*>(hapticFeedback);
            if (new_hapticvibration_value->type == XR_TYPE_HAPTIC_VIBRATION) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback",
                                                                objects_info,false, true, new_hapticvibration_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrApplyHapticFeedback param hapticFeedback";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
        // Validate if XrHapticBaseHeader is a child structure of type XrHapticAmplitudeEnvelopeVibrationFB and it is valid
        {
            const XrHapticAmplitudeEnvelopeVibrationFB* new_hapticamplitudeenvelopevibrationfb_value = reinterpret_cast<const XrHapticAmplitudeEnvelopeVibrationFB*>(hapticFeedback);
            if (new_hapticamplitudeenvelopevibrationfb_value->type == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback",
                                                                objects_info,false, true, new_hapticamplitudeenvelopevibrationfb_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrApplyHapticFeedback param hapticFeedback";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
        // Validate if XrHapticBaseHeader is a child structure of type XrHapticPcmVibrationFB and it is valid
        {
            const XrHapticPcmVibrationFB* new_hapticpcmvibrationfb_value = reinterpret_cast<const XrHapticPcmVibrationFB*>(hapticFeedback);
            if (new_hapticpcmvibrationfb_value->type == XR_TYPE_HAPTIC_PCM_VIBRATION_FB) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback",
                                                                objects_info,false, true, new_hapticpcmvibrationfb_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrApplyHapticFeedback param hapticFeedback";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
        // Validate that the base-structure XrHapticBaseHeader is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback", objects_info,
                                                        true, true, hapticFeedback);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                objects_info,
                                "Command xrApplyHapticFeedback param hapticFeedback is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}